

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O2

int element3(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  int iVar1;
  code *pcVar2;
  
  if (tok == 0xf) {
    return 0;
  }
  if (tok == 0x15) {
    iVar1 = 0;
    pcVar2 = element4;
  }
  else {
    pcVar2 = declClose;
    if (tok == 0x18) {
      iVar1 = 0x28;
    }
    else if (tok == 0x24) {
      iVar1 = 0x29;
    }
    else {
      iVar1 = -1;
      pcVar2 = error;
      if ((tok == 0x1c) && (state->documentEntity == 0)) {
        return 0x34;
      }
    }
  }
  state->handler = pcVar2;
  return iVar1;
}

Assistant:

static
int element3(PROLOG_STATE *state,
             int tok,
             const char *ptr,
             const char *end,
             const ENCODING *enc)
{
  cmExpatUnused(ptr);
  cmExpatUnused(end);
  cmExpatUnused(enc);
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_NONE;
  case XML_TOK_CLOSE_PAREN:
    state->handler = declClose;
    return XML_ROLE_GROUP_CLOSE;
  case XML_TOK_CLOSE_PAREN_ASTERISK:
    state->handler = declClose;
    return XML_ROLE_GROUP_CLOSE_REP;
  case XML_TOK_OR:
    state->handler = element4;
    return XML_ROLE_NONE;
  }
  return common(state, tok);
}